

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_expression.c
# Opt level: O0

AST * parse_additive_expression(Translation_Data *translation_data,Scope *scope)

{
  int iVar1;
  AST *pAVar2;
  AST_Binary_Expression *local_28;
  AST *hold;
  Scope *scope_local;
  Translation_Data *translation_data_local;
  
  local_28 = (AST_Binary_Expression *)parse_multiplicative_expression(translation_data,scope);
  while( true ) {
    while( true ) {
      if (translation_data->tokens->size == 0) {
        return (AST *)local_28;
      }
      iVar1 = *translation_data->tokens->first->data;
      if (iVar1 != 0x29) break;
      chomp(translation_data);
      pAVar2 = parse_multiplicative_expression(translation_data,scope);
      local_28 = get_binary_expression_tree((AST *)local_28,pAVar2,OP_ADDITION);
    }
    if (iVar1 != 0x2b) break;
    chomp(translation_data);
    pAVar2 = parse_multiplicative_expression(translation_data,scope);
    local_28 = get_binary_expression_tree((AST *)local_28,pAVar2,OP_SUBTRACTION);
  }
  return (AST *)local_28;
}

Assistant:

struct AST* parse_additive_expression(struct Translation_Data *translation_data,struct Scope *scope)
{
	
	struct AST *hold;
	hold=parse_multiplicative_expression(translation_data,scope);

	while(translation_data->tokens->size!=0)
	{
		switch(((struct token*)translation_data->tokens->first->data)->type)
		{
			case KW_PLUS:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_multiplicative_expression(translation_data,scope),OP_ADDITION);
				break;
			case KW_MINUS:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_multiplicative_expression(translation_data,scope),OP_SUBTRACTION);
				break;
			default:
				return hold;
		}
	}

	return hold;
}